

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int ret;
  char **pargv;
  int nargc;
  zt_opt_def options [8];
  lfd local_func_data;
  int flag2;
  int flag;
  long long_int;
  char *str;
  int bool_type;
  undefined1 uVar2;
  undefined7 in_stack_fffffffffffffe79;
  char *validate;
  char *args;
  code *argv_00;
  int *argc_00;
  undefined1 auStack_68 [52];
  undefined1 local_34 [4];
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  int local_14 [4];
  undefined4 local_4;
  
  local_4 = 0;
  local_14[0] = 0;
  local_20 = 0;
  local_28 = 0;
  local_2c = 0;
  local_30 = 0;
  memset(local_34,0,4);
  uVar2 = 0x62;
  validate = "bool";
  args = "[true|false]";
  argv_00 = zt_opt_bool_int;
  argc_00 = local_14;
  memset(auStack_68,0,0x30);
  iVar1 = zt_opt_process_args(argc_00,(char **)argv_00,(zt_opt_def_t *)args,
                              (zt_opt_validate)validate,
                              (zt_opt_error)CONCAT71(in_stack_fffffffffffffe79,uVar2));
  if (iVar1 < 0) {
    zt_log_lprintf((zt_log_ty *)0x0,zt_log_err,"Error processing args");
    exit(1);
  }
  return 0;
}

Assistant:

int
main(int argc, char ** argv) {
    int        bool_type        = 0;
    char     * str              = NULL;
    long       long_int         = 0;
    int        flag             = 0;
    int        flag2            = 0;
    struct lfd local_func_data  = {
        0
    };

    #define LONG_DESC "This is a really long string intended to overflow the wrap widths so that we can test how well they work.  This is only a test"
    struct zt_opt_def options[] = {
        { 'h',        "help",     NULL,           zt_opt_help_stdout,   "[options]",      "this help text"   },
        { 'b',        "bool",     "[true|false]", zt_opt_bool_int,      &bool_type,       "boolean test"     },
        { 's',        "string",   "text",         zt_opt_string,        &str,             LONG_DESC          },
        { 'f',        "func",     "arg",          local_func_with_args, &local_func_data, "generic function" },
        { 'l',        "long",     "int",          zt_opt_long,          &long_int,        "a long integer"   },
        { 'q',        ZT_OPT_NLO, NULL,           zt_opt_flag_int,      &flag,            "short only flag"  },
        { ZT_OPT_NSO, "quiet",    NULL,           zt_opt_flag_int,      &flag2,           "long only flag"   },
        { ZT_OPT_END() }
    };

    int               nargc = argc;
    char           ** pargv = argv;

    int               ret   = zt_opt_process_args(&nargc, pargv, options, NULL, NULL);
    if (ret < 0) {
        zt_log_printf(zt_log_err, "Error processing args");
        exit(1);
    }

    return 0;
}